

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void tb_invalidate_phys_addr_aarch64(AddressSpace *as,hwaddr addr,MemTxAttrs attrs)

{
  _Bool _Var1;
  ram_addr_t rVar2;
  hwaddr local_38;
  hwaddr l;
  MemoryRegion *mr;
  ram_addr_t ram_addr;
  hwaddr addr_local;
  AddressSpace *as_local;
  MemTxAttrs attrs_local;
  
  local_38 = 1;
  ram_addr = addr;
  addr_local = (hwaddr)as;
  as_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate(as,addr,&ram_addr,&local_38,false,attrs);
  _Var1 = memory_region_is_ram((MemoryRegion *)l);
  if (_Var1) {
    rVar2 = memory_region_get_ram_addr_aarch64((MemoryRegion *)l);
    mr = (MemoryRegion *)(rVar2 + ram_addr);
    tb_invalidate_phys_page_range_aarch64
              (*(uc_struct_conflict2 **)(addr_local + 0x30),(tb_page_addr_t)mr,
               (tb_page_addr_t)&mr->subpage);
  }
  return;
}

Assistant:

void tb_invalidate_phys_addr(AddressSpace *as, hwaddr addr, MemTxAttrs attrs)
{
    ram_addr_t ram_addr;
    MemoryRegion *mr;
    hwaddr l = 1;

    mr = address_space_translate(as, addr, &addr, &l, false, attrs);
    if (!memory_region_is_ram(mr)) {
        return;
    }

    ram_addr = memory_region_get_ram_addr(mr) + addr;
    tb_invalidate_phys_page_range(as->uc, ram_addr, ram_addr + 1);
}